

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

CartesianPosition * ear::toCartesianPosition(PolarPosition position)

{
  CartesianPosition *in_RDI;
  Vector3d cartesian;
  double in_stack_00000018;
  Vector3d local_28;
  
  cart(&local_28,
       cartesian.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1],cartesian.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2],in_stack_00000018);
  in_RDI->X = local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0];
  in_RDI->Y = local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1];
  in_RDI->Z = local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2];
  return in_RDI;
}

Assistant:

CartesianPosition toCartesianPosition(PolarPosition position) {
    auto cartesian = toCartesianVector3d(position);
    return CartesianPosition(cartesian[0], cartesian[1], cartesian[2]);
  }